

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_MeshCacheItem * __thiscall ON_MeshCache::Internal_FindHelper(ON_MeshCache *this,ON_UUID mesh_id)

{
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  ON_MeshCacheItem *b;
  ON_MeshCacheItem *pOVar5;
  uint uVar6;
  uint uVar7;
  ON_MeshCacheItem *local_48;
  ON_UUID_struct local_40;
  
  local_40.Data4 = mesh_id.Data4;
  local_40._0_8_ = mesh_id._0_8_;
  bVar3 = ::operator==(&FineMeshId,&local_40);
  if (bVar3) {
    bVar3 = false;
  }
  else {
    bVar3 = ::operator==(&CoarseMeshId,&local_40);
    bVar3 = !bVar3;
  }
  b = this->m_impl;
  uVar6 = 0;
  if (b == (ON_MeshCacheItem *)0x0) {
    pOVar5 = (ON_MeshCacheItem *)0x0;
    local_48 = (ON_MeshCacheItem *)0x0;
  }
  else {
    uVar7 = 0xffffffff;
    local_48 = (ON_MeshCacheItem *)0x0;
    pOVar5 = (ON_MeshCacheItem *)0x0;
    do {
      bVar4 = ::operator==(&local_40,&b->m_mesh_id);
      if (bVar4) {
        return b;
      }
      if ((((!bVar3) &&
           (peVar2 = (b->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           peVar2 != (element_type *)0x0)) && (uVar1 = (peVar2->m_F).m_count, uVar1 != 0)) &&
         (2 < (uint)(peVar2->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) {
        if (uVar6 < uVar1) {
          uVar6 = uVar1;
          local_48 = b;
        }
        if (uVar1 < uVar7) {
          pOVar5 = b;
          uVar7 = uVar1;
        }
      }
      b = b->m_next;
    } while (b != (ON_MeshCacheItem *)0x0);
  }
  bVar3 = ::operator==(&CoarseMeshId,&local_40);
  if (!bVar3) {
    bVar3 = ::operator==(&FineMeshId,&local_40);
    pOVar5 = (ON_MeshCacheItem *)0x0;
    if (bVar3) {
      pOVar5 = local_48;
    }
  }
  return pOVar5;
}

Assistant:

class ON_MeshCacheItem* ON_MeshCache::Internal_FindHelper(
  ON_UUID mesh_id
  ) const
{
  unsigned int coarse_mesh_face_count = 0xFFFFFFFFU;
  unsigned int fine_mesh_face_count = 0;
  ON_MeshCacheItem* item_coarse_mesh = nullptr;
  ON_MeshCacheItem* item_fine_mesh = nullptr;

  const bool bCountFaces = (ON_MeshCache::FineMeshId == mesh_id || ON_MeshCache::CoarseMeshId == mesh_id);

  for (ON_MeshCacheItem* item = m_impl; nullptr != item; item = item->m_next)
  {
    if (mesh_id == item->m_mesh_id)
      return item;
    if (false == bCountFaces)
      continue;
    const ON_Mesh* mesh = item->m_mesh_sp.get();
    if (nullptr == mesh)
      continue;
    unsigned int mesh_face_count = mesh->FaceUnsignedCount();
    if (mesh_face_count <= 0 || mesh->VertexUnsignedCount() < 3)
      continue;
    if (mesh_face_count > fine_mesh_face_count)
    {
      item_fine_mesh = item;
      fine_mesh_face_count = mesh_face_count;
    }
    if (mesh_face_count < coarse_mesh_face_count)
    {
      item_coarse_mesh = item;
      coarse_mesh_face_count = mesh_face_count;
    }
  }
  
  if (ON_MeshCache::CoarseMeshId == mesh_id)
    return item_coarse_mesh;
  
  if (ON_MeshCache::FineMeshId == mesh_id)
    return item_fine_mesh;

  return nullptr;
}